

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedbackOverflowQueryMultipleStreamsBase::drawStreams
          (TransformFeedbackOverflowQueryMultipleStreamsBase *this,GLsizei count0,GLsizei count1,
          GLsizei count2,GLsizei count3)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TransformFeedbackOverflowQueryFunctionalBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar3 + 0xb48))
                    ((this->super_TransformFeedbackOverflowQueryFunctionalBase).m_program,"stream");
  TransformFeedbackOverflowQueryFunctionalBase::beginQueries
            (&this->super_TransformFeedbackOverflowQueryFunctionalBase);
  (**(code **)(lVar3 + 0x1500))(uVar2,0);
  (**(code **)(lVar3 + 0x538))(0,0,count0);
  (**(code **)(lVar3 + 0x1500))(uVar2,1);
  (**(code **)(lVar3 + 0x538))(0,0,count1);
  (**(code **)(lVar3 + 0x1500))(uVar2,2);
  (**(code **)(lVar3 + 0x538))(0,0,count2);
  (**(code **)(lVar3 + 0x1500))(uVar2,3);
  (**(code **)(lVar3 + 0x538))(0,0,count3);
  TransformFeedbackOverflowQueryFunctionalBase::endQueries
            (&this->super_TransformFeedbackOverflowQueryFunctionalBase);
  return;
}

Assistant:

void drawStreams(GLsizei count0, GLsizei count1 = 0, GLsizei count2 = 0, GLsizei count3 = 0)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		GLint streamLoc = gl.getUniformLocation(m_program, "stream");

		beginQueries();

		gl.uniform1ui(streamLoc, 0);
		gl.drawArrays(GL_POINTS, 0, count0);

		gl.uniform1ui(streamLoc, 1);
		gl.drawArrays(GL_POINTS, 0, count1);

		gl.uniform1ui(streamLoc, 2);
		gl.drawArrays(GL_POINTS, 0, count2);

		gl.uniform1ui(streamLoc, 3);
		gl.drawArrays(GL_POINTS, 0, count3);

		endQueries();
	}